

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_componentNotEqualByVariable_Test::TestBody(Equality_componentNotEqualByVariable_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ComponentPtr c2;
  ComponentPtr c1;
  VariablePtr v2;
  VariablePtr v1;
  long *local_90;
  AssertionResult local_88;
  long local_78 [2];
  AssertHelper local_68 [8];
  byte local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  shared_ptr *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  shared_ptr *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_88._0_8_ = (shared_ptr *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"c","");
  libcellml::Component::create((string *)&local_40);
  if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = (shared_ptr *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"c","");
  libcellml::Component::create((string *)&local_50);
  if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = (shared_ptr *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"vA","");
  libcellml::Variable::create(local_20);
  if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = (shared_ptr *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"vB","");
  libcellml::Variable::create(local_30);
  if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Component::addVariable(local_40);
  libcellml::Component::addVariable(local_50);
  local_88._0_8_ = local_50;
  local_88.message_.ptr_ = local_48;
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_40);
  local_60[0] = bVar1 ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_0011ec74;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.message_.ptr_);
    if ((local_60[0] & 1) == 0) {
LAB_0011ec74:
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(char *)local_60,"c1->equals(c2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x2fd,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=(local_68,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(local_68);
      if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
        operator_delete((void *)local_88._0_8_,local_78[0] + 1);
      }
      if (((local_90 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88._0_8_ = local_40;
  local_88.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_50);
  local_60[0] = bVar1 ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 == 0) goto LAB_0011ee3a;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.message_.ptr_);
    if ((local_60[0] & 1) != 0) goto LAB_0011ee3a;
  }
  testing::Message::Message((Message *)&local_90);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_88,(char *)local_60,"c2->equals(c1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x2fe,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=(local_68,(Message *)&local_90);
  testing::internal::AssertHelper::~AssertHelper(local_68);
  if ((shared_ptr *)local_88._0_8_ != (shared_ptr *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (((local_90 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_90 != (long *)0x0)) {
    (**(code **)(*local_90 + 8))();
  }
LAB_0011ee3a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}